

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void block(LexState *ls)

{
  undefined1 local_28 [8];
  BlockCnt bl;
  FuncState *fs;
  LexState *ls_local;
  
  bl._8_8_ = ls->fs;
  enterblock((FuncState *)bl._8_8_,(BlockCnt *)local_28,'\0');
  chunk(ls);
  leaveblock((FuncState *)bl._8_8_);
  return;
}

Assistant:

static void block(LexState*ls){
FuncState*fs=ls->fs;
BlockCnt bl;
enterblock(fs,&bl,0);
chunk(ls);
leaveblock(fs);
}